

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecMarkLevels(Vec_Wec_t *vCubes,Vec_Int_t *vLevels)

{
  int i;
  Vec_Int_t *pVVar1;
  int i_00;
  
  i_00 = 0;
  while( true ) {
    if (vLevels->nSize <= i_00) {
      return;
    }
    i = Vec_IntEntry(vLevels,i_00);
    pVVar1 = Vec_WecEntry(vCubes,i);
    if (((uint)pVVar1->nCap >> 0x1e & 1) != 0) break;
    pVVar1->nCap = pVVar1->nCap | 0x40000000;
    i_00 = i_00 + 1;
  }
  __assert_fail("!Vec_WecIntHasMark( vCube )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                ,0x294,"void Vec_WecMarkLevels(Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

static inline void Vec_WecMarkLevels( Vec_Wec_t * vCubes, Vec_Int_t * vLevels )
{
    Vec_Int_t * vCube;
    int i;
    Vec_WecForEachLevelVec( vLevels, vCubes, vCube, i )
    {
        assert( !Vec_WecIntHasMark( vCube ) );
        Vec_WecIntXorMark( vCube );
    }
}